

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::BeginGreedyLoopNoBacktrackInst::Exec
          (BeginGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  Label LVar2;
  LoopInfo *pLVar3;
  char *pcVar4;
  
  pLVar3 = Matcher::LoopIdToLoopInfo(matcher,(this->super_GreedyLoopNoBacktrackMixin).loopId);
  pLVar3->number = 0;
  pLVar3->startInputOffset = *inputOffset;
  pcVar4 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
           Push<UnifiedRegex::ResumeCont>
                     (&contStack->
                       super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
  CVar1 = *inputOffset;
  LVar2 = (this->super_GreedyLoopNoBacktrackMixin).exitLabel;
  pcVar4[8] = '\0';
  *(undefined ***)pcVar4 = &PTR_Print_013e01e8;
  *(CharCount *)(pcVar4 + 0xc) = CVar1;
  *(Label *)(pcVar4 + 0x10) = LVar2;
  *instPointer = *instPointer + 9;
  Matcher::PushStats(matcher,contStack,input);
  return false;
}

Assistant:

inline bool BeginGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
        PUSH(contStack, ResumeCont, inputOffset, exitLabel);
        instPointer += sizeof(*this);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        return false;
    }